

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O0

void __thiscall
CorUnix::CSHRSynchCache<CorUnix::CSynchData>::Flush
          (CSHRSynchCache<CorUnix::CSynchData> *this,CPalThread *pthrCurrent,bool fDontLock)

{
  _USHRSynchCacheStackNode *p_Var1;
  SHMPTR shridTemp;
  USHRSynchCacheStackNode *pTemp;
  USHRSynchCacheStackNode *pNode;
  bool fDontLock_local;
  CPalThread *pthrCurrent_local;
  CSHRSynchCache<CorUnix::CSynchData> *this_local;
  
  if (!fDontLock) {
    Lock(this,pthrCurrent);
  }
  pTemp = ::Volatile::operator_cast_to__USHRSynchCacheStackNode_((Volatile *)this);
  Volatile<CorUnix::CSHRSynchCache<CorUnix::CSynchData>::_USHRSynchCacheStackNode_*>::operator=
            (&this->m_pHead,(_USHRSynchCacheStackNode *)0x0);
  Volatile<int>::operator=(&this->m_iDepth,0);
  if (!fDontLock) {
    Unlock(this,pthrCurrent);
  }
  while (pTemp != (USHRSynchCacheStackNode *)0x0) {
    p_Var1 = (pTemp->pointers).pNext;
    SHMfree((pTemp->pointers).shrid);
    pTemp = p_Var1;
  }
  return;
}

Assistant:

void Flush(CPalThread * pthrCurrent, bool fDontLock = false)
        {
            USHRSynchCacheStackNode * pNode, * pTemp;
            SharedID shridTemp;

            if (!fDontLock)
            {
                Lock(pthrCurrent);
            }
            pNode = m_pHead;
            m_pHead = NULL;
            m_iDepth = 0;
            if (!fDontLock)
            {
                Unlock(pthrCurrent);
            }
            
            while (pNode)
            {
                pTemp = pNode;
                pNode = pNode->pointers.pNext;
                shridTemp = pTemp->pointers.shrid;
                RawSharedObjectFree(shridTemp);
            } 
        }